

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

WebPEncodingError
VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main,int use_cache)

{
  uint32_t *palette;
  undefined8 *puVar1;
  int *piVar2;
  WebPConfig *pWVar3;
  WebPPicture *pic;
  undefined1 auVar4 [16];
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  WebPWorker *pWVar9;
  WebPWorker *pWVar10;
  WebPWorker *pWVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  VP8LEncoder *enc;
  WebPWorkerInterface *pWVar18;
  uint32_t *ptr;
  byte bVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  double *pdVar23;
  int iVar24;
  undefined1 *puVar25;
  undefined4 uVar26;
  uint uVar27;
  WebPEncodingError WVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  WebPWorker *pWVar34;
  ulong uVar35;
  uint *puVar36;
  uint uVar37;
  uint *puVar38;
  uint uVar39;
  uint32_t *array;
  bool bVar40;
  bool bVar41;
  float fVar42;
  VP8LBitWriter bw_side;
  WebPWorker worker_side;
  WebPWorker worker_main;
  StreamEncodeContext params_main;
  CrunchConfig crunch_configs [8];
  StreamEncodeContext params_side;
  WebPAuxStats stats_side;
  WebPEncodingError local_514;
  VP8LEncoder *local_510;
  undefined4 local_500;
  VP8LBitWriter local_498;
  WebPWorker local_468;
  WebPWorker local_438;
  double local_408 [2];
  VP8LBitWriter *local_3f8;
  VP8LEncoder *pVStack_3f0;
  undefined8 local_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  int local_304;
  WebPEncodingError local_2fc;
  WebPAuxStats *local_2f8;
  uint local_2e8 [2];
  undefined1 auStack_2e0 [12];
  undefined8 uStack_2d4;
  undefined8 local_2cc;
  double local_208 [2];
  VP8LBitWriter *local_1f8;
  VP8LEncoder *pVStack_1f0;
  undefined1 auStack_1e8 [12];
  undefined1 auStack_1dc [12];
  undefined8 auStack_1d0 [25];
  uint local_104;
  undefined4 local_fc;
  WebPAuxStats *local_f8;
  WebPAuxStats local_ec;
  
  enc = VP8LEncoderNew(config,picture);
  pWVar18 = WebPGetWorkerInterface();
  if (enc == (VP8LEncoder *)0x0) {
    local_510 = (VP8LEncoder *)0x0;
    WVar28 = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto LAB_0013f642;
  }
  pWVar3 = enc->config_;
  pic = enc->pic_;
  uVar27 = pic->width;
  uVar22 = (ulong)uVar27;
  iVar17 = pic->height;
  iVar16 = pWVar3->method;
  palette = enc->palette_sorted_;
  iVar12 = WebPGetColorPalette(pic,palette);
  enc->palette_size_ = iVar12;
  if (iVar12 < 0x101) {
    qsort(palette,(long)iVar12,4,PaletteCompareColorsForQsort);
    iVar20 = 9;
  }
  else {
    enc->palette_size_ = 0;
    iVar20 = 7;
  }
  iVar20 = iVar20 - iVar16;
  do {
    bVar19 = (byte)iVar20;
    iVar24 = 1 << (bVar19 & 0x1f);
    iVar24 = ((uint)(iVar24 + pic->height + -1) >> (bVar19 & 0x1f)) *
             ((uint)(pic->width + -1 + iVar24) >> (bVar19 & 0x1f));
    iVar20 = iVar20 + 1;
  } while (0xa28 < iVar24);
  uVar29 = 6;
  if (3 < iVar16) {
    uVar29 = iVar16 == 4 | 4;
  }
  uVar13 = ((uint)(0xa28 < iVar24) + iVar20) - 1;
  uVar21 = 9;
  if ((int)uVar13 < 9) {
    uVar21 = uVar13;
  }
  uVar13 = 2;
  if (2 < (int)uVar21) {
    uVar13 = uVar21;
  }
  if ((int)uVar13 <= (int)uVar29) {
    uVar29 = uVar13;
  }
  enc->histo_bits_ = uVar13;
  enc->transform_bits_ = uVar29;
  if (iVar16 == 0) {
    local_2e8[0] = (iVar12 < 0x101) + 3;
    local_2e8[1] = (uint)(0x100 < iVar12) * 3;
    local_500 = 0;
    uVar22 = 1;
    uVar35 = 1;
    uVar26 = 0;
LAB_0013f1a9:
    if (0 < (int)uVar22) {
      puVar25 = auStack_2e0 + 4;
      uVar30 = 0;
      do {
        uVar33 = 0;
        do {
          *(uint *)(puVar25 + uVar33 * 8 + -4) = 4 - (uint)(uVar33 == 0);
          *(undefined4 *)(puVar25 + uVar33 * 8) = uVar26;
          uVar33 = uVar33 + 1;
        } while (uVar35 != uVar33);
        *(int *)((long)&uStack_2d4 + uVar30 * 0x1c + 4) = (int)uVar35;
        uVar30 = uVar30 + 1;
        puVar25 = puVar25 + 0x1c;
      } while (uVar30 != uVar22);
    }
    bVar40 = false;
  }
  else {
    iVar20 = enc->palette_size_;
    local_500 = 1;
    uVar21 = (iVar20 < 0x11) + 1;
    if (iVar20 < 1) {
      uVar21 = 1;
    }
    uVar26 = 0;
    if (iVar12 < 0x101 && iVar20 < 0x11) {
      uVar27 = 4;
      bVar41 = false;
    }
    else {
      puVar38 = pic->argb;
      iVar24 = pic->argb_stride;
      ptr = (uint32_t *)WebPSafeCalloc(0xd,0x400);
      if (ptr == (uint32_t *)0x0) {
        bVar41 = true;
        local_500 = 0;
      }
      else {
        if (0 < iVar17) {
          uVar13 = *puVar38;
          iVar15 = 0;
          puVar36 = (uint *)0x0;
          do {
            if (0 < (int)uVar27) {
              uVar35 = 0;
              uVar14 = uVar13;
              do {
                uVar13 = puVar38[uVar35];
                uVar39 = (uVar13 | 0xff0000) - (uVar14 & 0xff00ff00);
                uVar14 = (uVar13 | 0xff00) - (uVar14 & 0xff00ff);
                uVar37 = uVar14 & 0xff00ff | uVar39 & 0xff00ff00;
                if ((uVar37 != 0) && ((puVar36 == (uint *)0x0 || (uVar13 != puVar36[uVar35])))) {
                  ptr[uVar13 >> 0x18] = ptr[uVar13 >> 0x18] + 1;
                  piVar2 = (int *)((long)ptr + (ulong)(uVar13 >> 0xe & 0x3fc) + 0x1000);
                  *piVar2 = *piVar2 + 1;
                  ptr[(ulong)(uVar13 >> 8 & 0xff) + 0x200] =
                       ptr[(ulong)(uVar13 >> 8 & 0xff) + 0x200] + 1;
                  ptr[(ulong)(uVar13 & 0xff) + 0x600] = ptr[(ulong)(uVar13 & 0xff) + 0x600] + 1;
                  ptr[(ulong)(uVar39 >> 0x18) + 0x100] = ptr[(ulong)(uVar39 >> 0x18) + 0x100] + 1;
                  piVar2 = (int *)((long)ptr + (ulong)((uVar14 & 0xff0000) >> 0xe) + 0x1400);
                  *piVar2 = *piVar2 + 1;
                  ptr[(ulong)(uVar39 >> 8 & 0xff) + 0x300] =
                       ptr[(ulong)(uVar39 >> 8 & 0xff) + 0x300] + 1;
                  ptr[(ulong)(uVar14 & 0xff) + 0x700] = ptr[(ulong)(uVar14 & 0xff) + 0x700] + 1;
                  ptr[(ulong)((uVar13 >> 0x10) - ((int)uVar13 >> 8) & 0xff) + 0x800] =
                       ptr[(ulong)((uVar13 >> 0x10) - ((int)uVar13 >> 8) & 0xff) + 0x800] + 1;
                  ptr[(ulong)(uVar13 - ((int)uVar13 >> 8) & 0xff) + 0xa00] =
                       ptr[(ulong)(uVar13 - ((int)uVar13 >> 8) & 0xff) + 0xa00] + 1;
                  ptr[(ulong)((uVar37 >> 0x10) - ((int)uVar37 >> 8) & 0xff) + 0x900] =
                       ptr[(ulong)((uVar37 >> 0x10) - ((int)uVar37 >> 8) & 0xff) + 0x900] + 1;
                  ptr[(ulong)(uVar14 - ((int)uVar37 >> 8) & 0xff) + 0xb00] =
                       ptr[(ulong)(uVar14 - ((int)uVar37 >> 8) & 0xff) + 0xb00] + 1;
                  piVar2 = (int *)((long)ptr +
                                  (ulong)(((uVar13 >> 0x13) + uVar13) * 0x39c5fba7 >> 0x16 &
                                         0xfffffffc) + 0x3000);
                  *piVar2 = *piVar2 + 1;
                }
                uVar35 = uVar35 + 1;
                uVar14 = uVar13;
              } while (uVar22 != uVar35);
            }
            iVar15 = iVar15 + 1;
            puVar36 = puVar38;
            puVar38 = puVar38 + iVar24;
          } while (iVar15 != iVar17);
        }
        ptr[0x900] = ptr[0x900] + 1;
        ptr[0xb00] = ptr[0xb00] + 1;
        ptr[0x500] = ptr[0x500] + 1;
        ptr[0x300] = ptr[0x300] + 1;
        ptr[0x700] = ptr[0x700] + 1;
        ptr[0x100] = ptr[0x100] + 1;
        lVar31 = 0;
        array = ptr;
        do {
          dVar5 = VP8LBitsEntropy(array,0x100);
          local_408[lVar31] = dVar5;
          lVar31 = lVar31 + 1;
          array = array + 0x100;
        } while (lVar31 != 0xd);
        bVar19 = (byte)uVar29;
        iVar24 = 1 << (bVar19 & 0x1f);
        fVar42 = (float)(((iVar24 + iVar17) - 1U >> (bVar19 & 0x1f)) *
                        ((uVar27 + iVar24) - 1 >> (bVar19 & 0x1f)));
        local_1f8 = (VP8LBitWriter *)(local_408[0] + local_3c8 + (double)local_3f8 + local_3b8);
        local_208[1] = dStack_3e0 + local_408[1] + (double)pVStack_3f0 + dStack_3d0 +
                       (double)(fVar42 * 3.807355);
        local_208[0] = local_3e8 + local_408[0] + (double)local_3f8 + local_3d8;
        pVStack_1f0 = (VP8LEncoder *)
                      (local_408[1] + dStack_3c0 + (double)pVStack_3f0 + dStack_3b0 +
                      (double)(fVar42 * 4.5849624));
        local_3a8 = local_3a8 + (double)(iVar20 << 3);
        auVar4._8_4_ = SUB84(local_3a8,0);
        auVar4._0_8_ = pVStack_1f0;
        auVar4._12_4_ = (int)((ulong)local_3a8 >> 0x20);
        auStack_1e8._0_8_ = auVar4._8_8_;
        uVar35 = 1;
        uVar27 = 0;
        uVar29 = 0 >> (bVar19 & 0x1f);
        do {
          puVar38 = (uint *)(uVar35 & 0xffffffff);
          uVar13 = (uint)uVar35;
          if (local_208[uVar29] < local_208[uVar35] || local_208[uVar29] == local_208[uVar35]) {
            puVar38 = (uint *)(ulong)uVar27;
            uVar13 = uVar29;
          }
          uVar29 = uVar13;
          uVar35 = uVar35 + 1;
          uVar27 = (uint)puVar38;
        } while (((ulong)(iVar12 < 0x101) | 4) != uVar35);
        lVar31 = 1;
        do {
          if (ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[(long)puVar38 * 2 + 1] * 0x100 + lVar31]
              != 0 || ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[(long)puVar38 * 2] * 0x100 +
                          lVar31] != 0) {
            local_500 = 0;
            goto LAB_0013f04e;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0x100);
        local_500 = 1;
LAB_0013f04e:
        WebPSafeFree(ptr);
        bVar41 = false;
      }
      uVar27 = (uint)puVar38;
    }
    uVar35 = (ulong)uVar21;
    if (!bVar41) {
      if (((iVar16 != 6) || (pWVar3->quality != 100.0)) || (NAN(pWVar3->quality))) {
        local_2e8[1] = (0x100 < iVar12) + 1 + (uint)(0x100 < iVar12);
        uVar22 = 1;
        local_2e8[0] = uVar27;
        if (iVar16 == 5 && 75.0 <= pWVar3->quality) {
          uVar26 = 1;
          if (uVar27 == 4) {
            local_2cc = 0x100000005;
            uVar22 = 2;
          }
          else {
            uVar22 = 1;
          }
        }
      }
      else {
        uVar22 = 0;
        uVar27 = 0;
        do {
          iVar17 = (int)uVar22;
          if (iVar12 < 0x101 || uVar27 < 4) {
            local_2e8[(long)iVar17 * 7] = uVar27;
            if ((uVar27 & 6) == 4 && iVar12 < 0x101) {
              *(undefined4 *)(auStack_2e0 + (long)iVar17 * 0x1c + -4) = 1;
              iVar17 = iVar17 + 1;
              local_2e8[(long)iVar17 * 7] = uVar27;
              *(undefined4 *)(auStack_2e0 + (long)iVar17 * 0x1c + -4) = 2;
            }
            else {
              *(undefined4 *)(auStack_2e0 + (long)iVar17 * 0x1c + -4) = 3;
            }
            uVar22 = (ulong)(iVar17 + 1);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != 6);
        uVar26 = 1;
      }
    }
    bVar40 = true;
    if (!bVar41) goto LAB_0013f1a9;
  }
  iVar17 = (int)uVar22;
  if (((!bVar40) && (iVar16 = EncoderInit(enc), iVar16 != 0)) &&
     (iVar16 = VP8LBitWriterInit(&local_498,0), iVar16 != 0)) {
    uVar27 = 0;
    if (0 < config->thread_level) {
      uVar27 = (int)(uVar22 >> 0x1f) + iVar17 >> 1;
      uVar22 = (ulong)uVar27;
      local_104 = uVar27;
      if (1 < iVar17) {
        lVar31 = (long)iVar17 * 0x1c + (long)(int)uVar27 * -0x1c;
        lVar32 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_2e8 + lVar32 + lVar31);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          uVar8 = *(undefined8 *)((long)(auStack_2e0 + lVar32 + lVar31 + 4) + 8);
          *(undefined8 *)(auStack_1dc + lVar32 + 4) =
               *(undefined8 *)(auStack_2e0 + lVar32 + lVar31 + 4);
          *(undefined8 *)((long)auStack_1d0 + lVar32) = uVar8;
          *(undefined8 *)(auStack_1e8 + lVar32 + 4) = uVar6;
          *(undefined8 *)(auStack_1dc + lVar32) = uVar7;
          lVar32 = lVar32 + 0x1c;
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
      }
    }
    if (iVar17 - uVar27 != 0 && (int)uVar27 <= iVar17) {
      memcpy((void *)((long)&local_3e8 + 4),local_2e8,(ulong)(iVar17 + ~uVar27) * 0x1c + 0x1c);
    }
    iVar16 = 0;
    local_514 = VP8_ENC_OK;
    local_510 = (VP8LEncoder *)0x0;
    local_304 = iVar17 - uVar27;
    do {
      bVar41 = iVar16 == 0;
      pWVar34 = &local_468;
      if (bVar41) {
        pWVar34 = &local_438;
      }
      pdVar23 = local_208;
      if (bVar41) {
        pdVar23 = local_408;
      }
      *pdVar23 = (double)config;
      pdVar23[1] = (double)picture;
      *(int *)(pdVar23 + 4) = use_cache;
      *(undefined4 *)(pdVar23 + 0x21) = local_500;
      if (bVar41) {
        local_2f8 = picture->stats;
        pWVar9 = &local_438;
        pWVar10 = &local_438;
        pWVar11 = &local_438;
        local_3f8 = bw_main;
        pVStack_3f0 = enc;
LAB_0013f496:
        (*pWVar18->Init)(pWVar34);
        pWVar9->data1 = pdVar23;
        pWVar10->data2 = (void *)0x0;
        pWVar11->hook = EncodeStreamHook;
        bVar41 = false;
        bVar40 = true;
      }
      else {
        local_f8 = picture->stats;
        if (picture->stats != (WebPAuxStats *)0x0) {
          local_f8 = &local_ec;
        }
        iVar17 = VP8LBitWriterClone(bw_main,&local_498);
        bVar41 = true;
        if (((iVar17 != 0) &&
            (local_1f8 = &local_498, local_510 = VP8LEncoderNew(config,picture),
            local_510 != (VP8LEncoder *)0x0)) && (iVar17 = EncoderInit(local_510), iVar17 != 0)) {
          iVar17 = enc->transform_bits_;
          local_510->histo_bits_ = enc->histo_bits_;
          local_510->transform_bits_ = iVar17;
          local_510->palette_size_ = enc->palette_size_;
          memcpy(local_510->palette_,enc->palette_,0x400);
          memcpy(local_510->palette_sorted_,palette,0x400);
          pWVar9 = &local_468;
          pWVar10 = &local_468;
          pWVar11 = &local_468;
          pVStack_1f0 = local_510;
          goto LAB_0013f496;
        }
        local_514 = VP8_ENC_ERROR_OUT_OF_MEMORY;
        bVar40 = false;
      }
      if (!bVar40) goto LAB_0013f504;
      bVar40 = iVar16 != 0;
      iVar16 = iVar16 + -1;
      bVar41 = false;
      if (((int)uVar27 < 1) || (bVar40)) goto LAB_0013f504;
    } while( true );
  }
  local_510 = (VP8LEncoder *)0x0;
  WVar28 = VP8_ENC_ERROR_OUT_OF_MEMORY;
LAB_0013f642:
  VP8LBitWriterWipeOut(&local_498);
  VP8LEncoderDelete(enc);
  VP8LEncoderDelete(local_510);
  return WVar28;
LAB_0013f504:
  WVar28 = local_514;
  if (!bVar41) {
    if (bVar41) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    if (uVar27 != 0) {
      iVar17 = (*pWVar18->Reset)(&local_468);
      WVar28 = VP8_ENC_ERROR_OUT_OF_MEMORY;
      if (iVar17 == 0) goto LAB_0013f642;
      if (picture->stats != (WebPAuxStats *)0x0) {
        memcpy(&local_ec,picture->stats,0xbc);
      }
      local_fc = 0;
      (*pWVar18->Launch)(&local_468);
    }
    (*pWVar18->Execute)(&local_438);
    iVar17 = (*pWVar18->Sync)(&local_438);
    (*pWVar18->End)(&local_438);
    if (uVar27 == 0) {
      WVar28 = local_2fc;
      if (iVar17 != 0) {
        WVar28 = local_514;
      }
    }
    else {
      iVar16 = (*pWVar18->Sync)(&local_468);
      (*pWVar18->End)(&local_468);
      if ((iVar17 == 0) || (iVar16 == 0)) {
        pdVar23 = local_208;
        if (iVar17 == 0) {
          pdVar23 = local_408;
        }
        WVar28 = *(WebPEncodingError *)((long)pdVar23 + 0x10c);
      }
      else {
        WVar28 = local_514;
        if (local_498.cur_ + ((long)(local_498.used_ + 7 >> 3) - (long)local_498.buf_) <
            bw_main->cur_ + ((long)(bw_main->used_ + 7 >> 3) - (long)bw_main->buf_)) {
          VP8LBitWriterSwap(bw_main,&local_498);
          if (picture->stats != (WebPAuxStats *)0x0) {
            memcpy(picture->stats,&local_ec,0xbc);
          }
        }
      }
    }
  }
  goto LAB_0013f642;
}

Assistant:

WebPEncodingError VP8LEncodeStream(const WebPConfig* const config,
                                   const WebPPicture* const picture,
                                   VP8LBitWriter* const bw_main,
                                   int use_cache) {
  WebPEncodingError err = VP8_ENC_OK;
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  // Analyze image (entropy, num_palettes etc)
  if (enc_main == NULL ||
      !EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main) || !VP8LBitWriterInit(&bw_side, 0)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs_[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs_ = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs_[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs_ = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config_ = config;
      param->picture_ = picture;
      param->use_cache_ = use_cache;
      param->red_and_blue_always_zero_ = red_and_blue_always_zero;
      if (idx == 0) {
        param->stats_ = picture->stats;
        param->bw_ = bw_main;
        param->enc_ = enc_main;
      } else {
        param->stats_ = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        param->bw_ = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, picture);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits_ = enc_main->histo_bits_;
        enc_side->transform_bits_ = enc_main->transform_bits_;
        enc_side->palette_size_ = enc_main->palette_size_;
        memcpy(enc_side->palette_, enc_main->palette_,
               sizeof(enc_main->palette_));
        memcpy(enc_side->palette_sorted_, enc_main->palette_sorted_,
               sizeof(enc_main->palette_sorted_));
        param->enc_ = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      err = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    // This line is only useful to remove a Clang static analyzer warning.
    params_side.err_ = VP8_ENC_OK;
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      err = ok_main ? params_side.err_ : params_main.err_;
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  } else {
    if (!ok_main) {
      err = params_main.err_;
      goto Error;
    }
  }

Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return err;
}